

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.h
# Opt level: O2

void __thiscall
webrtc::AudioProcessingImpl::ApmCaptureState::ApmCaptureState
          (ApmCaptureState *this,bool transient_suppressor_enabled,
          vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
          *array_geometry,SphericalPointf target_direction)

{
  this->aec_system_delay_jumps = -1;
  this->delay_offset_ms = 0;
  this->was_stream_delay_set = false;
  this->last_stream_delay_ms = 0;
  this->last_aec_system_delay_ms = 0;
  this->stream_delay_jumps = -1;
  this->output_will_be_muted = false;
  this->key_pressed = false;
  this->transient_suppressor_enabled = transient_suppressor_enabled;
  std::vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
  vector(&this->array_geometry,array_geometry);
  *(long *)(this->target_direction).s = target_direction.s._0_8_;
  (this->target_direction).s[2] = target_direction.s[2];
  (this->capture_audio)._M_t.
  super___uniq_ptr_impl<webrtc::AudioBuffer,_std::default_delete<webrtc::AudioBuffer>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::AudioBuffer_*,_std::default_delete<webrtc::AudioBuffer>_>.
  super__Head_base<0UL,_webrtc::AudioBuffer_*,_false>._M_head_impl = (AudioBuffer *)0x0;
  (this->fwd_proc_format).sample_rate_hz_ = 16000;
  (this->fwd_proc_format).num_channels_ = 0;
  (this->fwd_proc_format).has_keyboard_ = false;
  (this->fwd_proc_format).num_frames_ = 0xa0;
  this->split_rate = 16000;
  return;
}

Assistant:

ApmCaptureState(bool transient_suppressor_enabled,
                    const std::vector<Point>& array_geometry,
                    SphericalPointf target_direction)
        : aec_system_delay_jumps(-1),
          delay_offset_ms(0),
          was_stream_delay_set(false),
          last_stream_delay_ms(0),
          last_aec_system_delay_ms(0),
          stream_delay_jumps(-1),
          output_will_be_muted(false),
          key_pressed(false),
          transient_suppressor_enabled(transient_suppressor_enabled),
          array_geometry(array_geometry),
          target_direction(target_direction),
          fwd_proc_format(kSampleRate16kHz),
          split_rate(kSampleRate16kHz) {}